

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare::operator()
          (ExtensionCompare *this,ExtensionEntry *a,ExtensionEntry *b)

{
  bool bVar1;
  tuple<google::protobuf::stringpiece_internal::StringPiece,_int> local_48;
  tuple<google::protobuf::stringpiece_internal::StringPiece,_int> local_30;
  
  local_30.super__Tuple_impl<0UL,_google::protobuf::stringpiece_internal::StringPiece,_int>.
  super__Head_base<0UL,_google::protobuf::stringpiece_internal::StringPiece,_false>._M_head_impl =
       ExtensionEntry::extendee(a,this->index);
  local_30.super__Tuple_impl<0UL,_google::protobuf::stringpiece_internal::StringPiece,_int>.
  super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)a->extension_number;
  local_48.super__Tuple_impl<0UL,_google::protobuf::stringpiece_internal::StringPiece,_int>.
  super__Head_base<0UL,_google::protobuf::stringpiece_internal::StringPiece,_false>._M_head_impl =
       ExtensionEntry::extendee(b,this->index);
  local_48.super__Tuple_impl<0UL,_google::protobuf::stringpiece_internal::StringPiece,_int>.
  super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
       (_Head_base<1UL,_int,_false>)b->extension_number;
  bVar1 = std::
          __tuple_compare<std::tuple<google::protobuf::stringpiece_internal::StringPiece,_int>,_std::tuple<google::protobuf::stringpiece_internal::StringPiece,_int>,_0UL,_2UL>
          ::__less(&local_30,&local_48);
  return bVar1;
}

Assistant:

bool operator()(const ExtensionEntry& a, const ExtensionEntry& b) const {
      return std::make_tuple(a.extendee(index), a.extension_number) <
             std::make_tuple(b.extendee(index), b.extension_number);
    }